

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_alloc.c
# Opt level: O1

void * mspace_calloc(mspace msp,size_t n_elements,size_t elem_size)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  size_t bytes;
  void *pvVar3;
  
  if (n_elements == 0) {
    bytes = 0;
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = n_elements;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = elem_size;
    bytes = SUB168(auVar1 * auVar2,0);
    if ((0xffff < (elem_size | n_elements)) && (SUB168(auVar1 * auVar2,8) != 0)) {
      bytes = 0xffffffffffffffff;
    }
  }
  pvVar3 = mspace_malloc(msp,bytes);
  if ((pvVar3 != (void *)0x0) && ((*(byte *)((long)pvVar3 + -8) & 3) != 0)) {
    pvVar3 = memset(pvVar3,0,bytes);
    return pvVar3;
  }
  return pvVar3;
}

Assistant:

void* mspace_calloc(mspace msp, size_t n_elements, size_t elem_size) {
  void* mem;
  size_t req = 0;
  mstate ms = (mstate)msp;
  if (!ok_magic(ms)) {
    USAGE_ERROR_ACTION(ms,ms);
    return 0;
  }
  if (n_elements != 0) {
    req = n_elements * elem_size;
    if (((n_elements | elem_size) & ~(size_t)0xffff) &&
        (req / n_elements != elem_size))
      req = MAX_SIZE_T; /* force downstream failure on overflow */
  }
  mem = internal_malloc(ms, req);
  if (mem != 0 && calloc_must_clear(mem2chunk(mem)))
    memset(mem, 0, req);
  return mem;
}